

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O2

DdNode * cuddZddUnion(DdManager *zdd,DdNode *P,DdNode *Q)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *data;
  DdNode *pDVar4;
  int iVar5;
  ulong uVar6;
  DdHalfWord id;
  
  if (zdd->zero == P) {
    return Q;
  }
  if (P == Q || zdd->zero == Q) {
    return P;
  }
  pDVar3 = cuddCacheLookup2Zdd(zdd,cuddZddUnion,P,Q);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  iVar2 = 0x7fffffff;
  iVar5 = 0x7fffffff;
  if ((ulong)P->index != 0x7fffffff) {
    iVar5 = zdd->permZ[P->index];
  }
  if ((ulong)Q->index != 0x7fffffff) {
    iVar2 = zdd->permZ[Q->index];
  }
  if (iVar5 < iVar2) {
    pDVar3 = cuddZddUnion(zdd,(P->type).kids.E,Q);
    if (pDVar3 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    uVar6 = (ulong)pDVar3 & 0xfffffffffffffffe;
    *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
    id = P->index;
    pDVar4 = (P->type).kids.T;
  }
  else {
    if (iVar5 <= iVar2) {
      pDVar3 = cuddZddUnion(zdd,(P->type).kids.T,(Q->type).kids.T);
      if (pDVar3 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddZddUnion(zdd,(P->type).kids.E,(Q->type).kids.E);
      if (pDVar4 != (DdNode *)0x0) {
        uVar6 = (ulong)pDVar4 & 0xfffffffffffffffe;
        *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
        data = cuddZddGetNode(zdd,P->index,pDVar3,pDVar4);
        if (data == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(zdd,pDVar3);
          pDVar3 = pDVar4;
          goto LAB_0063c58a;
        }
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        goto LAB_0063c4ed;
      }
      goto LAB_0063c58a;
    }
    pDVar3 = cuddZddUnion(zdd,P,(Q->type).kids.E);
    if (pDVar3 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    uVar6 = (ulong)pDVar3 & 0xfffffffffffffffe;
    *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
    id = Q->index;
    pDVar4 = (Q->type).kids.T;
  }
  data = cuddZddGetNode(zdd,id,pDVar4,pDVar3);
  if (data != (DdNode *)0x0) {
LAB_0063c4ed:
    *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + -1;
    cuddCacheInsert2(zdd,cuddZddUnion,P,Q,data);
    return data;
  }
LAB_0063c58a:
  Cudd_RecursiveDerefZdd(zdd,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddZddUnion(
  DdManager * zdd,
  DdNode * P,
  DdNode * Q)
{
    int         p_top, q_top;
    DdNode      *empty = DD_ZERO(zdd), *t, *e, *res;
    DdManager   *table = zdd;

    statLine(zdd);
    if (P == empty)
        return(Q);
    if (Q == empty)
        return(P);
    if (P == Q)
        return(P);

    /* Check cache */
    res = cuddCacheLookup2Zdd(table, cuddZddUnion, P, Q);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P))
        p_top = P->index;
    else
        p_top = zdd->permZ[P->index];
    if (cuddIsConstant(Q))
        q_top = Q->index;
    else
        q_top = zdd->permZ[Q->index];
    if (p_top < q_top) {
        e = cuddZddUnion(zdd, cuddE(P), Q);
        if (e == NULL) return (NULL);
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, cuddT(P), e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(e);
    } else if (p_top > q_top) {
        e = cuddZddUnion(zdd, P, cuddE(Q));
        if (e == NULL) return(NULL);
        cuddRef(e);
        res = cuddZddGetNode(zdd, Q->index, cuddT(Q), e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(e);
    } else {
        t = cuddZddUnion(zdd, cuddT(P), cuddT(Q));
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddZddUnion(zdd, cuddE(P), cuddE(Q));
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(table, cuddZddUnion, P, Q, res);

    return(res);

}